

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_gost_err.c
# Opt level: O0

void ERR_GOST_error(int function,int reason,char *file,int line)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  
  if (lib_code == 0) {
    lib_code = ERR_get_next_error_library();
  }
  ERR_new();
  ERR_set_debug("/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/e_gost_err.c"
                ,0xe9,"(unknown function)");
  ERR_set_error(lib_code,in_ESI,0);
  ERR_set_debug(in_RDX,in_ECX,0);
  return;
}

Assistant:

void ERR_GOST_error(int function, int reason, char *file, int line)
{
    if (lib_code == 0)
        lib_code = ERR_get_next_error_library();
#ifndef OPENSSL_ERR_NEW_WORLD_ORDER
    ERR_PUT_error(lib_code, function, reason, file, line);
#else
    ERR_raise(lib_code, reason);
    ERR_set_debug(file, line, NULL);
#endif
}